

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_XMLNode * __thiscall
ON_XMLNodePrivate::AttachChildNode(ON_XMLNodePrivate *this,ON_XMLNode *pNode)

{
  ON_XMLNodePrivate *pOVar1;
  int iVar2;
  ON_XMLNode **ppOVar3;
  
  if (pNode != (ON_XMLNode *)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    if (this->m_last_child == (ON_XMLNode *)0x0) {
      ppOVar3 = &this->m_first_child;
    }
    else {
      ppOVar3 = &this->m_last_child->_private->m_next_sibling;
    }
    *ppOVar3 = pNode;
    this->m_last_child = pNode;
    pOVar1 = pNode->_private;
    pOVar1->m_next_sibling = (ON_XMLNode *)0x0;
    pOVar1->m_parent = this->m_node;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return pNode;
}

Assistant:

ON_XMLNode* ON_XMLNodePrivate::AttachChildNode(ON_XMLNode* pNode)
{
  if (nullptr == pNode)
    return nullptr;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr == m_last_child)
  {
    // There are no children - add one.
    m_last_child = m_first_child = pNode;
  }
  else
  {
    // There are children - add one to the end.
    m_last_child->_private->m_next_sibling = pNode;
    m_last_child = pNode;
  }

  pNode->_private->m_next_sibling = nullptr;
  pNode->_private->m_parent = &m_node;

  return pNode;
}